

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

int * Abc_SclHashLookup(SC_Lib *p,char *pName)

{
  char cVar1;
  int iVar2;
  undefined8 *puVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar9 = p->nBins;
  uVar5 = 0;
  uVar8 = 0;
  while( true ) {
    cVar1 = pName[uVar5];
    if (cVar1 == '\0') break;
    uVar8 = uVar8 + (int)cVar1 * (int)cVar1 *
                    *(int *)(Abc_SclHashString_s_Primes + ((ulong)uVar5 % 10) * 4);
    uVar5 = uVar5 + 1;
  }
  uVar7 = (ulong)uVar8 % (ulong)uVar9;
  while( true ) {
    iVar6 = (int)uVar7;
    if ((int)uVar9 <= iVar6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                    ,0x3e,"int *Abc_SclHashLookup(SC_Lib *, char *)");
    }
    piVar4 = p->pBins;
    if (piVar4[iVar6] == -1) break;
    puVar3 = (undefined8 *)Vec_PtrEntry(&p->vCells,piVar4[iVar6]);
    iVar2 = strcmp(pName,(char *)*puVar3);
    if (iVar2 == 0) {
      piVar4 = p->pBins;
      break;
    }
    uVar9 = p->nBins;
    uVar7 = (long)(iVar6 + 1) % (long)(int)uVar9 & 0xffffffff;
  }
  return piVar4 + iVar6;
}

Assistant:

int * Abc_SclHashLookup( SC_Lib * p, char * pName )
{
    int i;
    for ( i = Abc_SclHashString(pName, p->nBins); i < p->nBins; i = (i + 1) % p->nBins )
        if ( p->pBins[i] == -1 || !strcmp(pName, SC_LibCell(p, p->pBins[i])->pName) )
            return p->pBins + i;
    assert( 0 );
    return NULL;
}